

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

mecab_learner_node_t * __thiscall
MeCab::Tokenizer<mecab_learner_node_t,_mecab_learner_path_t>::lookup<false>
          (Tokenizer<mecab_learner_node_t,_mecab_learner_path_t> *this,char *begin,char *end,
          Allocator<mecab_learner_node_t,_mecab_learner_path_t> *allocator,Lattice *lattice)

{
  Token *pTVar1;
  Dictionary *pDVar2;
  pointer ppVar3;
  long lVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  size_t sVar8;
  unsigned_short uVar9;
  CharInfo CVar10;
  int iVar11;
  CharInfo CVar12;
  uint uVar13;
  CharInfo CVar14;
  mecab_learner_node_t *__s;
  char *pcVar15;
  result_pair_type *prVar16;
  pointer ppDVar17;
  char *pcVar18;
  long lVar19;
  mecab_learner_node_t *pmVar20;
  uint *puVar21;
  char *pcVar22;
  ulong uVar23;
  char *pcVar24;
  undefined1 auVar25 [16];
  size_t mblen;
  size_t local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  CharProperty *local_60;
  result_pair_type *local_58;
  undefined8 local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  local_80 = 0;
  pcVar15 = begin + 0xffff;
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    pcVar15 = end;
  }
  local_60 = &this->property_;
  pcVar22 = begin;
  if (pcVar15 == begin) {
    CVar10 = (CharInfo)0x0;
  }
  else {
    CVar14 = this->space_;
    do {
      CVar10 = CharProperty::getCharInfo(local_60,pcVar22,pcVar15,&local_80);
      if (((uint)CVar14 & (uint)CVar10 & 0x3ffff) == 0) break;
      pcVar22 = pcVar22 + local_80;
      CVar14 = CVar10;
    } while (pcVar22 != pcVar15);
  }
  ppDVar17 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_78 = pcVar15;
  local_68 = begin;
  if (ppDVar17 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __s = (mecab_learner_node_t *)0x0;
  }
  else {
    prVar16 = *(result_pair_type **)(allocator + 0x70);
    local_38 = (long)pcVar15 - (long)pcVar22;
    local_40 = (long)pcVar22 - (long)begin;
    __s = (mecab_learner_node_t *)0x0;
    local_48 = CONCAT44(local_48._4_4_,(uint)CVar10 >> 0x12);
    local_58 = prVar16;
    do {
      local_50 = (char *)Darts::
                         DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                         ::
                         commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                                   ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                                     *)&(*ppDVar17)->da_,pcVar22,prVar16,0x200,local_38,0);
      if (local_50 != (char *)0x0) {
        pcVar15 = (char *)0x0;
        do {
          uVar13 = prVar16[(long)pcVar15].value;
          local_70 = pcVar15;
          if ((uVar13 & 0xff) != 0) {
            iVar11 = (int)uVar13 >> 8;
            pTVar1 = (*ppDVar17)->token_;
            uVar23 = 0;
            pmVar20 = __s;
            do {
              __s = FreeList<mecab_learner_node_t>::alloc
                              (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
              memset(__s,0,0x98);
              lVar19 = *(long *)(allocator + 8);
              *(long *)(allocator + 8) = lVar19 + 1;
              __s->id = (uint)lVar19;
              pDVar2 = *ppDVar17;
              auVar25 = ZEXT416(*(uint *)((long)&pTVar1[iVar11].lcAttr + uVar23));
              auVar25 = pshuflw(auVar25,auVar25,0xe1);
              __s->rcAttr = (short)auVar25._0_4_;
              __s->lcAttr = (short)((uint)auVar25._0_4_ >> 0x10);
              __s->posid = *(unsigned_short *)((long)&pTVar1[iVar11].posid + uVar23);
              __s->wcost2 = *(short *)((long)&pTVar1[iVar11].wcost + uVar23);
              __s->feature = pDVar2->feature_ + *(uint *)((long)&pTVar1[iVar11].feature + uVar23);
              uVar9 = (unsigned_short)prVar16[(long)pcVar15].length;
              __s->length = uVar9;
              __s->rlength = uVar9 + (short)local_40;
              __s->surface = pcVar22;
              __s->stat = '\0';
              __s->char_type = (uchar)local_48;
              __s->bnext = pmVar20;
              uVar23 = uVar23 + 0x10;
              pmVar20 = __s;
            } while ((uVar13 & 0xff) << 4 != uVar23);
          }
          pcVar15 = local_70 + 1;
          prVar16 = local_58;
        } while (pcVar15 != local_50);
      }
      ppDVar17 = ppDVar17 + 1;
    } while (ppDVar17 !=
             (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  sVar8 = local_80;
  if (((int)CVar10 < 0) || (__s == (mecab_learner_node_t *)0x0)) {
    pcVar15 = pcVar22 + local_80;
    if (local_78 < pcVar15) {
      ppVar3 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
      lVar19 = *(long *)((long)&ppVar3->second + uVar23);
      if (lVar19 != 0) {
        sVar5 = (short)local_68;
        puVar21 = (uint *)(*(long *)((long)&ppVar3->first + uVar23) + 8);
        pmVar20 = __s;
        do {
          __s = FreeList<mecab_learner_node_t>::alloc
                          (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
          memset(__s,0,0x98);
          lVar4 = *(long *)(allocator + 8);
          *(long *)(allocator + 8) = lVar4 + 1;
          __s->id = (uint)lVar4;
          auVar25 = pshuflw(ZEXT416(puVar21[-2]),ZEXT416(puVar21[-2]),0xe1);
          __s->rcAttr = (short)auVar25._0_4_;
          __s->lcAttr = (short)((uint)auVar25._0_4_ >> 0x10);
          __s->posid = (unsigned_short)puVar21[-1];
          __s->wcost2 = *(short *)((long)puVar21 + -2);
          __s->feature = (this->unkdic_).feature_ + *puVar21;
          __s->char_type = (uchar)((uint)CVar10 >> 0x12);
          __s->surface = pcVar22;
          __s->length = (unsigned_short)sVar8;
          __s->rlength = (short)pcVar15 - sVar5;
          __s->stat = '\x01';
          __s->bnext = pmVar20;
          pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar18 != (char *)0x0) {
            __s->feature = pcVar18;
          }
          puVar21 = puVar21 + 4;
          lVar19 = lVar19 + -1;
          pmVar20 = __s;
        } while (lVar19 != 0);
      }
      if (__s != (mecab_learner_node_t *)0x0) {
        return __s;
      }
      __s = (mecab_learner_node_t *)0x0;
    }
    pcVar18 = local_78;
    sVar5 = (short)pcVar22;
    if (((uint)CVar10 >> 0x1e & 1) == 0) {
      pcVar24 = (char *)0x0;
    }
    else {
      pcVar24 = pcVar15;
      if (pcVar15 == local_78) {
        uVar23 = 0;
      }
      else {
        uVar23 = 0;
        CVar14 = CVar10;
        do {
          CVar12 = CharProperty::getCharInfo(local_60,pcVar24,pcVar18,&local_80);
          if (((uint)CVar14 & (uint)CVar12 & 0x3ffff) == 0) break;
          pcVar24 = pcVar24 + local_80;
          uVar23 = uVar23 + 1;
          CVar14 = CVar12;
        } while (pcVar24 != pcVar18);
      }
      if (uVar23 <= this->max_grouping_size_) {
        ppVar3 = (this->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
        lVar19 = *(long *)((long)&ppVar3->second + uVar23);
        if (lVar19 != 0) {
          sVar7 = (short)pcVar24;
          sVar6 = (short)local_68;
          puVar21 = (uint *)(*(long *)((long)&ppVar3->first + uVar23) + 8);
          pmVar20 = __s;
          local_70 = pcVar24;
          do {
            __s = FreeList<mecab_learner_node_t>::alloc
                            (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
            memset(__s,0,0x98);
            lVar4 = *(long *)(allocator + 8);
            *(long *)(allocator + 8) = lVar4 + 1;
            __s->id = (uint)lVar4;
            auVar25 = pshuflw(ZEXT416(puVar21[-2]),ZEXT416(puVar21[-2]),0xe1);
            __s->rcAttr = (short)auVar25._0_4_;
            __s->lcAttr = (short)((uint)auVar25._0_4_ >> 0x10);
            __s->posid = (unsigned_short)puVar21[-1];
            __s->wcost2 = *(short *)((long)puVar21 + -2);
            __s->feature = (this->unkdic_).feature_ + *puVar21;
            __s->char_type = (uchar)((uint)CVar10 >> 0x12);
            __s->surface = pcVar22;
            __s->length = sVar7 - sVar5;
            __s->rlength = sVar7 - sVar6;
            __s->stat = '\x01';
            __s->bnext = pmVar20;
            pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar18 != (char *)0x0) {
              __s->feature = pcVar18;
            }
            puVar21 = puVar21 + 4;
            lVar19 = lVar19 + -1;
            pcVar18 = local_78;
            pmVar20 = __s;
            pcVar24 = local_70;
          } while (lVar19 != 0);
        }
      }
    }
    uVar13 = (uint)CVar10 >> 0x1a & 0xf;
    local_48 = (ulong)uVar13;
    if ((uVar13 != 0) && (pcVar15 <= pcVar18)) {
      local_50 = (char *)(CONCAT44(local_50._4_4_,CVar10) & 0xffffffff0003ffff);
      uVar23 = 1;
      prVar16 = (result_pair_type *)(ulong)(((uint)CVar10 >> 0x12 & 0xff) << 4);
      local_70 = pcVar24;
      local_58 = prVar16;
      do {
        if (pcVar15 != pcVar24) {
          ppVar3 = (this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar19 = *(long *)((long)&prVar16->length + (long)ppVar3);
          local_40 = uVar23;
          if (lVar19 != 0) {
            sVar6 = (short)local_68;
            puVar21 = (uint *)(*(long *)((long)&prVar16->value + (long)ppVar3) + 8);
            pmVar20 = __s;
            do {
              __s = FreeList<mecab_learner_node_t>::alloc
                              (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
              memset(__s,0,0x98);
              lVar4 = *(long *)(allocator + 8);
              *(long *)(allocator + 8) = lVar4 + 1;
              __s->id = (uint)lVar4;
              auVar25 = pshuflw(ZEXT416(puVar21[-2]),ZEXT416(puVar21[-2]),0xe1);
              __s->rcAttr = (short)auVar25._0_4_;
              __s->lcAttr = (short)((uint)auVar25._0_4_ >> 0x10);
              __s->posid = (unsigned_short)puVar21[-1];
              __s->wcost2 = *(short *)((long)puVar21 + -2);
              __s->feature = (this->unkdic_).feature_ + *puVar21;
              __s->char_type = (uchar)((uint)CVar10 >> 0x12);
              __s->surface = pcVar22;
              __s->length = (short)pcVar15 - sVar5;
              __s->rlength = (short)pcVar15 - sVar6;
              __s->stat = '\x01';
              __s->bnext = pmVar20;
              pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
              if (pcVar18 != (char *)0x0) {
                __s->feature = pcVar18;
              }
              puVar21 = puVar21 + 4;
              lVar19 = lVar19 + -1;
              pmVar20 = __s;
            } while (lVar19 != 0);
          }
          CVar14 = CharProperty::getCharInfo(local_60,pcVar15,local_78,&local_80);
          if (((uint)local_50 & (uint)CVar14) == 0) break;
          pcVar15 = pcVar15 + local_80;
          uVar23 = local_40;
          prVar16 = local_58;
          pcVar18 = local_78;
          pcVar24 = local_70;
        }
        if ((local_48 <= uVar23) || (uVar23 = uVar23 + 1, pcVar18 < pcVar15)) break;
      } while( true );
    }
    if (__s == (mecab_learner_node_t *)0x0) {
      ppVar3 = (this->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar23 = (ulong)((uint)CVar10 >> 0xe & 0xff0);
      lVar19 = *(long *)((long)&ppVar3->second + uVar23);
      if (lVar19 == 0) {
        __s = (mecab_learner_node_t *)0x0;
      }
      else {
        sVar6 = (short)local_68;
        puVar21 = (uint *)(*(long *)((long)&ppVar3->first + uVar23) + 8);
        pmVar20 = (mecab_learner_node_t *)0x0;
        do {
          __s = FreeList<mecab_learner_node_t>::alloc
                          (*(FreeList<mecab_learner_node_t> **)(allocator + 0x18));
          memset(__s,0,0x98);
          lVar4 = *(long *)(allocator + 8);
          *(long *)(allocator + 8) = lVar4 + 1;
          __s->id = (uint)lVar4;
          auVar25 = pshuflw(ZEXT416(puVar21[-2]),ZEXT416(puVar21[-2]),0xe1);
          __s->rcAttr = (short)auVar25._0_4_;
          __s->lcAttr = (short)((uint)auVar25._0_4_ >> 0x10);
          __s->posid = (unsigned_short)puVar21[-1];
          __s->wcost2 = *(short *)((long)puVar21 + -2);
          __s->feature = (this->unkdic_).feature_ + *puVar21;
          __s->char_type = (uchar)((uint)CVar10 >> 0x12);
          __s->surface = pcVar22;
          __s->length = (short)pcVar15 - sVar5;
          __s->rlength = (short)pcVar15 - sVar6;
          __s->stat = '\x01';
          __s->bnext = pmVar20;
          pcVar18 = (this->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar18 != (char *)0x0) {
            __s->feature = pcVar18;
          }
          puVar21 = puVar21 + 4;
          lVar19 = lVar19 + -1;
          pmVar20 = __s;
        } while (lVar19 != 0);
      }
    }
  }
  return __s;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}